

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::ClientImpl::process_socket
          (ClientImpl *this,Socket *socket,function<bool_(httplib::Stream_&)> *callback)

{
  _Manager_type p_Var1;
  bool bVar2;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type local_40;
  Stream local_38;
  socket_t local_30;
  time_t local_28;
  time_t local_20;
  time_t local_18;
  time_t local_10;
  
  local_30 = socket->sock;
  local_28 = this->read_timeout_sec_;
  local_20 = this->read_timeout_usec_;
  local_18 = this->write_timeout_sec_;
  local_10 = this->write_timeout_usec_;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (_Manager_type)0x0;
  local_40 = callback->_M_invoker;
  p_Var1 = (callback->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_58._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(callback->super__Function_base)._M_functor;
    local_58._8_8_ = *(undefined8 *)((long)&(callback->super__Function_base)._M_functor + 8);
    (callback->super__Function_base)._M_manager = (_Manager_type)0x0;
    callback->_M_invoker = (_Invoker_type)0x0;
    local_48 = p_Var1;
  }
  local_38._vptr_Stream = (_func_int **)&PTR__Stream_001446a8;
  if (local_48 != (_Manager_type)0x0) {
    bVar2 = (*local_40)(&local_58,&local_38);
    if (local_48 != (_Manager_type)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    return bVar2;
  }
  std::__throw_bad_function_call();
}

Assistant:

inline bool
	ClientImpl::process_socket(const Socket &socket,
							   std::function<bool(Stream &strm)> callback) {
		return detail::process_client_socket(
				socket.sock, read_timeout_sec_, read_timeout_usec_, write_timeout_sec_,
				write_timeout_usec_, std::move(callback));
	}